

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O3

DdNode * Cudd_addOrAbstract(DdManager *manager,DdNode *f,DdNode *cube)

{
  DdNode *pDVar1;
  
  if (((ulong)cube & 1) == 0) {
    pDVar1 = cube;
    do {
      if (manager->one == pDVar1) {
        do {
          manager->reordered = 0;
          pDVar1 = cuddAddOrAbstractRecur(manager,f,cube);
        } while (manager->reordered == 1);
        return pDVar1;
      }
    } while (((pDVar1->index != 0x7fffffff) && ((pDVar1->type).kids.E == manager->zero)) &&
            (pDVar1 = (pDVar1->type).kids.T, ((ulong)pDVar1 & 1) == 0));
  }
  fwrite("Error: Can only abstract cubes",0x1e,1,(FILE *)manager->err);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addOrAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode *res;

    if (addCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,"Error: Can only abstract cubes");
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddAddOrAbstractRecur(manager, f, cube);
    } while (manager->reordered == 1);
    return(res);

}